

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_int8.h
# Opt level: O3

float ncnn::lstm_dynamic_quantize_get_absmax(float *ptr,int size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 in_ZMM8 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  
  if (size < 8) {
    uVar5 = 0;
    auVar20 = ZEXT832(0);
  }
  else {
    uVar5 = size & 0x7ffffff8;
    auVar11 = ZEXT864(0);
    iVar7 = 7;
    auVar14._8_4_ = 0x7fffffff;
    auVar14._0_8_ = 0x7fffffff7fffffff;
    auVar14._12_4_ = 0x7fffffff;
    auVar14._16_4_ = 0x7fffffff;
    auVar14._20_4_ = 0x7fffffff;
    auVar14._24_4_ = 0x7fffffff;
    auVar14._28_4_ = 0x7fffffff;
    do {
      auVar20 = vandps_avx(auVar14,*(undefined1 (*) [32])ptr);
      auVar20 = vmaxps_avx(auVar11._0_32_,auVar20);
      auVar11 = ZEXT3264(auVar20);
      ptr = (float *)((long)ptr + 0x20);
      iVar7 = iVar7 + 8;
    } while (iVar7 < size);
  }
  auVar10 = vmaxps_avx(auVar20._16_16_,auVar20._0_16_);
  auVar3 = vshufpd_avx(auVar10,auVar10,3);
  auVar10 = vmaxps_avx(auVar10,auVar3);
  auVar3 = vmovshdup_avx(auVar10);
  auVar10 = vmaxss_avx(auVar10,auVar3);
  auVar3._12_4_ = 0;
  auVar3._0_12_ = ZEXT812(0);
  auVar3 = vmaxss_avx(auVar10,auVar3 << 0x20);
  auVar10 = ZEXT416(0) << 0x20;
  if ((int)(uVar5 | 3) < size) {
    auVar15._8_4_ = 0x7fffffff;
    auVar15._0_8_ = 0x7fffffff7fffffff;
    auVar15._12_4_ = 0x7fffffff;
    uVar6 = uVar5;
    do {
      auVar13 = vandps_avx(auVar15,*(undefined1 (*) [16])*(undefined1 (*) [32])ptr);
      auVar10 = vmaxps_avx(auVar10,auVar13);
      ptr = (float *)(*(undefined1 (*) [32])ptr + 0x10);
      uVar5 = uVar6 + 4;
      iVar7 = uVar6 + 7;
      uVar6 = uVar5;
    } while (iVar7 < size);
  }
  auVar15 = vshufpd_avx(auVar10,auVar10,3);
  auVar10 = vmaxps_avx(auVar10,auVar15);
  auVar15 = vmovshdup_avx(auVar10);
  auVar10 = vmaxss_avx(auVar10,auVar15);
  auVar10 = vmaxss_avx(auVar10,auVar3);
  if ((int)uVar5 < size) {
    uVar8 = CONCAT44(0,~uVar5 + size);
    auVar10 = vshufps_avx(auVar10,auVar10,0);
    auVar20._16_16_ = auVar10;
    auVar20._0_16_ = auVar10;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uVar8;
    auVar2 = vpshufd_avx(auVar10,0x44);
    uVar9 = 0;
    auVar12._8_8_ = 0x8000000000000000;
    auVar12._0_8_ = 0x8000000000000000;
    auVar10 = vorps_avx(auVar2,auVar12);
    auVar3 = vorps_avx(auVar2,auVar12);
    auVar13 = vpcmpeqd_avx(in_ZMM8._0_16_,in_ZMM8._0_16_);
    auVar15 = vorps_avx(auVar2,auVar12);
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar23._16_4_ = 0x7fffffff;
    auVar23._20_4_ = 0x7fffffff;
    auVar23._24_4_ = 0x7fffffff;
    auVar23._28_4_ = 0x7fffffff;
    do {
      auVar4 = auVar20;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = uVar9;
      auVar17 = vpshufd_avx(auVar17,0x44);
      auVar21._16_16_ = auVar17;
      auVar21._0_16_ = auVar17;
      auVar14 = vorps_avx(auVar21,_DAT_005a5540);
      auVar21 = vorps_avx(auVar21,_DAT_005a5560);
      auVar18._0_8_ = auVar21._16_8_ ^ 0x8000000000000000;
      auVar18._8_4_ = auVar21._24_4_;
      auVar18._12_4_ = auVar21._28_4_ ^ 0x80000000;
      auVar1 = vpcmpgtq_avx(auVar18,auVar10);
      auVar19._0_8_ = auVar21._0_8_ ^ 0x8000000000000000;
      auVar19._8_4_ = auVar21._8_4_;
      auVar19._12_4_ = auVar21._12_4_ ^ 0x80000000;
      auVar17 = vpcmpgtq_avx(auVar19,auVar3);
      auVar17 = vpackssdw_avx(auVar17,auVar1);
      auVar24._0_8_ = auVar14._16_8_ ^ 0x8000000000000000;
      auVar24._8_4_ = auVar14._24_4_;
      auVar24._12_4_ = auVar14._28_4_ ^ 0x80000000;
      auVar19 = vpcmpgtq_avx(auVar24,auVar10);
      auVar25._0_8_ = auVar14._0_8_ ^ 0x8000000000000000;
      auVar25._8_4_ = auVar14._8_4_;
      auVar25._12_4_ = auVar14._12_4_ ^ 0x80000000;
      auVar18 = vpcmpgtq_avx(auVar25,auVar15);
      auVar18 = vpackssdw_avx(auVar18,auVar19);
      auVar17 = vpackssdw_avx(auVar18 ^ auVar13,auVar13 ^ auVar17);
      auVar18 = vpmovsxwd_avx(auVar17);
      auVar17 = vpunpckhwd_avx(auVar17,auVar17);
      auVar22._16_16_ = auVar17;
      auVar22._0_16_ = auVar18;
      auVar20 = vmaskmovps_avx(auVar22,*(undefined1 (*) [32])(*(undefined1 (*) [32])ptr + uVar9 * 4)
                              );
      auVar20 = vandps_avx(auVar23,auVar20);
      auVar20 = vmaxps_avx(auVar20,auVar4);
      uVar9 = uVar9 + 8;
    } while ((uVar8 + 8 & 0xfffffffffffffff8) != uVar9);
    auVar10 = vorps_avx(auVar2,auVar12);
    auVar16._0_8_ = auVar21._0_8_ ^ 0x8000000000000000;
    auVar16._8_4_ = auVar21._8_4_;
    auVar16._12_4_ = auVar21._12_4_ ^ 0x80000000;
    auVar10 = vpcmpgtq_avx(auVar16,auVar10);
    auVar3 = vpackssdw_avx(auVar10,auVar1);
    auVar15 = vpcmpeqd_avx(auVar16,auVar16);
    auVar10 = vorps_avx(auVar2,auVar12);
    auVar13._8_4_ = auVar14._8_4_;
    auVar13._0_8_ = auVar14._0_8_ ^ 0x8000000000000000;
    auVar13._12_4_ = auVar14._12_4_ ^ 0x80000000;
    auVar10 = vpcmpgtq_avx(auVar13,auVar10);
    auVar10 = vpackssdw_avx(auVar10,auVar19);
    auVar10 = vblendvps_avx(auVar4._0_16_,auVar20._0_16_,auVar10 ^ auVar15);
    auVar3 = vblendvps_avx(auVar4._16_16_,auVar20._16_16_,auVar3 ^ auVar15);
    auVar10 = vmaxps_avx(auVar10,auVar3);
    auVar3 = vshufpd_avx(auVar10,auVar10,1);
    auVar10 = vmaxps_avx(auVar10,auVar3);
    auVar3 = vmovshdup_avx(auVar10);
    auVar10 = vmaxss_avx(auVar10,auVar3);
  }
  return auVar10._0_4_;
}

Assistant:

static float lstm_dynamic_quantize_get_absmax(const float* ptr, int size)
{
    float absmax = 0.f;

    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    __m512 _absmax_avx512 = _mm512_set1_ps(0.f);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        _absmax_avx512 = _mm512_max_ps(_absmax_avx512, abs512_ps(_p));
        ptr += 16;
    }
    absmax = std::max(absmax, _mm512_comp_reduce_max_ps(_absmax_avx512));
#endif // __AVX512F__
    __m256 _absmax_avx = _mm256_set1_ps(0.f);
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        _absmax_avx = _mm256_max_ps(_absmax_avx, abs256_ps(_p));
        ptr += 8;
    }
    absmax = std::max(absmax, _mm256_reduce_max_ps(_absmax_avx));
#endif // __AVX__
    __m128 _absmax = _mm_set1_ps(0.f);
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        _absmax = _mm_max_ps(_absmax, abs_ps(_p));
        ptr += 4;
    }
    absmax = std::max(absmax, _mm_reduce_max_ps(_absmax));
#endif // __SSE2__
    for (; i < size; i++)
    {
        absmax = std::max(absmax, (float)fabs(*ptr));
        ptr++;
    }

    return absmax;
}